

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.h
# Opt level: O2

void __thiscall
wallet::BerkeleyRODatabase::BerkeleyRODatabase(BerkeleyRODatabase *this,path *filepath,bool open)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined3 in_register_00000011;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_WalletDatabase).m_refcount = (__atomic_base<int>)0x0;
  (this->super_WalletDatabase).nUpdateCounter = (__atomic_base<unsigned_int>)0x0;
  (this->super_WalletDatabase).nLastSeen = 0;
  (this->super_WalletDatabase).nLastFlushed = 0;
  (this->super_WalletDatabase).nLastWalletUpdate = 0;
  (this->super_WalletDatabase)._vptr_WalletDatabase =
       (_func_int **)&PTR__BerkeleyRODatabase_01155e68;
  std::filesystem::__cxx11::path::path(&(this->m_filepath).super_path,&filepath->super_path);
  (this->m_records)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_records)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_records)._M_t._M_impl.super__Rb_tree_header;
  (this->m_records)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_records)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_records)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (CONCAT31(in_register_00000011,open) != 0) {
    (*(this->super_WalletDatabase)._vptr_WalletDatabase[2])(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BerkeleyRODatabase(const fs::path& filepath, bool open = true) : WalletDatabase(), m_filepath(filepath)
    {
        if (open) Open();
    }